

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esa.hxx
# Opt level: O0

long esaxx_private::
     suffixtree<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                T,__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> L,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> R,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> D,long n)

{
  uint uVar1;
  long lVar2;
  undefined1 auVar3 [8];
  long lVar4;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var5;
  reference plVar6;
  reference puVar7;
  reference pvVar8;
  bool bVar9;
  pair<long,_long> pVar10;
  long local_158;
  long local_118;
  pair<long,_long> local_110;
  undefined1 local_100 [8];
  pair<long,_long> cand;
  undefined1 local_e8 [8];
  pair<long,_long> cur;
  long i_3;
  size_t nodeNum;
  long local_b8 [2];
  pair<long,_long> local_a8;
  undefined1 local_98 [8];
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> S;
  long i_2;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> H;
  long j;
  long i_1;
  long h;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> PLCP;
  long i;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> Psi;
  long n_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> D_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> R_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> L_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA_local;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  T_local;
  
  if (n == 0) {
    T_local._M_current = (uint *)0x0;
  }
  else {
    i = (long)L._M_current;
    Psi._M_current = (long *)n;
    n_local = (long)D._M_current;
    D_local = R;
    R_local = L;
    L_local = SA;
    SA_local._M_current = (long *)T._M_current;
    plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator[](&L_local,n + -1);
    lVar2 = *plVar6;
    plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator[](&L_local,0);
    plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)&i,
                        *plVar6);
    *plVar6 = lVar2;
    for (PLCP._M_current = (long *)0x1; (long)PLCP._M_current < (long)Psi._M_current;
        PLCP._M_current = PLCP._M_current + 1) {
      plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[](&L_local,(long)PLCP._M_current + -1);
      lVar2 = *plVar6;
      plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[](&L_local,(difference_type)PLCP._M_current);
      plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)&i
                          ,*plVar6);
      *plVar6 = lVar2;
    }
    h = (long)D_local._M_current;
    i_1 = 0;
    for (j = 0; j < (long)Psi._M_current; j = j + 1) {
      plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)&i
                          ,j);
      H._M_current = (long *)*plVar6;
      while( true ) {
        bVar9 = false;
        if ((j + i_1 < (long)Psi._M_current) &&
           (bVar9 = false, (long)H._M_current + i_1 < (long)Psi._M_current)) {
          puVar7 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)&SA_local,j + i_1);
          uVar1 = *puVar7;
          puVar7 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)&SA_local,(long)H._M_current + i_1);
          bVar9 = uVar1 == *puVar7;
        }
        if (!bVar9) break;
        i_1 = i_1 + 1;
      }
      plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)&h
                          ,j);
      *plVar6 = i_1;
      if (0 < i_1) {
        i_1 = i_1 + -1;
      }
    }
    i_2 = (long)R_local._M_current;
    for (S.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (long)S.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage < (long)Psi._M_current;
        S.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&(S.
                               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + 1)) {
      plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[](&L_local,(difference_type)
                                   S.
                                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)&h
                          ,*plVar6);
      lVar2 = *plVar6;
      plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                          &i_2,(difference_type)
                               S.
                               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *plVar6 = lVar2;
    }
    plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)&i_2
                        ,0);
    *plVar6 = -1;
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
              ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_98);
    local_b8[1] = 0xffffffffffffffff;
    local_b8[0] = -1;
    local_a8 = std::make_pair<long,long>(local_b8 + 1,local_b8);
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::push_back
              ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_98,
               &local_a8);
    i_3 = 0;
    cur.second = 0;
    while( true ) {
      if ((long *)cur.second == Psi._M_current) {
        local_158 = -1;
      }
      else {
        plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            &i_2,cur.second);
        local_158 = *plVar6;
      }
      cand.second = local_158;
      std::pair<long,_long>::pair<long_&,_long,_true>
                ((pair<long,_long> *)local_e8,&cur.second,&cand.second);
      pvVar8 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::back
                         ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                          local_98);
      local_100 = (undefined1  [8])pvVar8->first;
      cand.first = pvVar8->second;
      while (auVar3 = local_100, cur.first < cand.first) {
        if (1 < cur.second - (long)local_100) {
          plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator[](&R_local,i_3);
          lVar4 = cur.second;
          *plVar6 = (long)auVar3;
          plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator[](&D_local,i_3);
          lVar2 = cand.first;
          *plVar6 = lVar4;
          plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)&n_local,i_3);
          *plVar6 = lVar2;
          i_3 = i_3 + 1;
        }
        local_e8 = local_100;
        std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::pop_back
                  ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                   local_98);
        pvVar8 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::back
                           ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                             *)local_98);
        std::pair<long,_long>::operator=((pair<long,_long> *)local_100,pvVar8);
      }
      if (cand.first < cur.first) {
        std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::push_back
                  ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                   local_98,(value_type *)local_e8);
      }
      _Var5._M_current = Psi._M_current;
      if ((long *)cur.second == Psi._M_current) break;
      plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[](&L_local,cur.second);
      local_118 = (long)_Var5._M_current + (1 - *plVar6);
      pVar10 = std::make_pair<long&,long>(&cur.second,&local_118);
      local_110 = pVar10;
      std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::push_back
                ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_98,
                 &local_110);
      cur.second = cur.second + 1;
    }
    T_local._M_current = (uint *)i_3;
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector
              ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_98);
  }
  return (long)T_local._M_current;
}

Assistant:

index_type suffixtree(string_type T, sarray_type SA, sarray_type L, sarray_type R, sarray_type D, index_type n){
  if (n == 0){
    return 0;
  }
  sarray_type Psi = L;
  Psi[SA[0]] = SA[n-1];
  for (index_type i = 1; i < n; ++i){
    Psi[SA[i]] = SA[i-1];
  }

  // Compare at most 2n log n charcters. Practically fastest
  // "Permuted Longest-Common-Prefix Array", Juha Karkkainen, CPM 09
  sarray_type PLCP = R;
  index_type h = 0;
  for (index_type i = 0; i < n; ++i){
    index_type j = Psi[i];
    while (i+h < n && j+h < n && 
	   T[i+h] == T[j+h]){
      ++h;
    }
    PLCP[i] = h;
    if (h > 0) --h;
  }

  sarray_type H = L;
  for (index_type i = 0; i < n; ++i){
    H[i] = PLCP[SA[i]];
  }
  H[0] = -1;

  std::vector<std::pair<index_type, index_type> > S;
  S.push_back(std::make_pair((index_type)-1, (index_type)-1));
  size_t nodeNum = 0;
  for (index_type i = 0; ; ++i){
    std::pair<index_type, index_type> cur (i, (i == n) ? -1 : H[i]);
    std::pair<index_type, index_type> cand(S.back());
    while (cand.second > cur.second){
      if (i - cand.first > 1){
	L[nodeNum] = cand.first;
	R[nodeNum] = i;
	D[nodeNum] = cand.second;
	++nodeNum;
      }
      cur.first = cand.first;
      S.pop_back();
      cand = S.back();
    }
    if (cand.second < cur.second){
      S.push_back(cur);
    }
    if (i == n) break;
    S.push_back(std::make_pair(i, n - SA[i] + 1));
  }
  return nodeNum;
}